

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::parseArgs(QPDFArgParser *this)

{
  char **ppcVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
  *pmVar2;
  option_table_t *poVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  element_type *peVar8;
  logic_error *this_00;
  long lVar9;
  size_type sVar10;
  char *pcVar11;
  pointer ppVar12;
  size_type sVar13;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  reference local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *choice;
  iterator __end5;
  iterator __begin5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  undefined1 local_260 [7];
  bool first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  string message_1;
  OptionEntry *oe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  string message;
  allocator<char> local_169;
  key_type local_168;
  _Base_ptr local_148;
  _Base_ptr local_140;
  _Base_ptr local_138;
  string local_130 [32];
  string local_110 [32];
  long local_f0;
  size_t equal_pos;
  allocator<char> local_d9;
  key_type local_d8;
  _Base_ptr local_b8;
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  string arg_s;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string o_arg;
  undefined1 local_48 [7];
  bool have_parameter;
  string parameter;
  char *arg;
  iterator oep;
  bool end_option;
  bool help_option;
  QPDFArgParser *this_local;
  
  selectMainOptionTable(this);
  checkCompletion(this);
  handleArgFileArguments(this);
  peVar8 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar8->cur_arg = 1;
  while( true ) {
    peVar8 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar7 = peVar8->cur_arg;
    peVar8 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if (peVar8->argc <= iVar7) {
      peVar8 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      if ((peVar8->bash_completion & 1U) == 0) {
        doFinalChecks(this);
      }
      else {
        handleCompletion(this);
      }
      return;
    }
    oep._M_node._7_1_ = 0;
    oep._M_node._6_1_ = 0;
    peVar8 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    arg = (char *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                  ::end(peVar8->option_table);
    peVar8 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    ppcVar1 = peVar8->argv;
    peVar8 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    parameter.field_2._8_8_ = ppcVar1[peVar8->cur_arg];
    std::__cxx11::string::string((string *)local_48);
    uVar4 = parameter.field_2._8_8_;
    o_arg.field_2._M_local_buf[0xf] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,(char *)uVar4,&local_71);
    std::allocator<char>::~allocator(&local_71);
    uVar4 = parameter.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,(char *)uVar4,&local_a9);
    std::allocator<char>::~allocator(&local_a9);
    iVar7 = strcmp((char *)parameter.field_2._8_8_,"--");
    if (iVar7 == 0) {
      peVar8 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pmVar2 = peVar8->option_table;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"--",&local_d9);
      local_b8 = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                 ::find(pmVar2,&local_d8);
      arg = (char *)local_b8;
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      oep._M_node._6_1_ = 1;
      peVar8 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      equal_pos = (size_t)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                          ::end(peVar8->option_table);
      bVar5 = std::operator==((_Self *)&arg,(_Self *)&equal_pos);
      if (bVar5) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"QPDFArgParser: -- handler not registered");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    else if ((*(char *)parameter.field_2._8_8_ == '-') &&
            (iVar7 = strcmp((char *)parameter.field_2._8_8_,"-"), iVar7 != 0)) {
      if (*(char *)(parameter.field_2._8_8_ + 1) == '-') {
        parameter.field_2._8_8_ = parameter.field_2._8_8_ + 2;
      }
      else {
        parameter.field_2._8_8_ = (char *)(parameter.field_2._8_8_ + 1);
        QTC::TC("libtests","QPDFArgParser single dash",0);
      }
      std::__cxx11::string::operator=((string *)local_a8,(char *)parameter.field_2._8_8_);
      local_f0 = -1;
      lVar9 = std::__cxx11::string::length();
      if (lVar9 != 0) {
        local_f0 = std::__cxx11::string::find((char)local_a8,0x3d);
      }
      if (local_f0 != -1) {
        o_arg.field_2._M_local_buf[0xf] = '\x01';
        std::__cxx11::string::substr((ulong)local_110,(ulong)local_a8);
        std::__cxx11::string::operator=((string *)local_48,local_110);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::substr((ulong)local_130,(ulong)local_a8);
        std::__cxx11::string::operator=((string *)local_a8,local_130);
        std::__cxx11::string::~string(local_130);
      }
      peVar8 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      if ((((peVar8->bash_completion & 1U) == 0) &&
          (peVar8 = std::
                    __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this), peVar8->argc == 2)) &&
         (peVar8 = std::
                   __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this), peVar8->cur_arg == 1)) {
        peVar8 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        sVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                 ::count(&peVar8->help_option_table,(key_type *)local_a8);
        if (sVar10 != 0) {
          QTC::TC("libtests","QPDFArgParser help option",0);
          peVar8 = std::
                   __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          local_138 = (_Base_ptr)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                      ::find(&peVar8->help_option_table,(key_type *)local_a8);
          oep._M_node._7_1_ = 1;
          arg = (char *)local_138;
        }
      }
      if ((((oep._M_node._7_1_ & 1) == 0) &&
          (uVar14 = std::__cxx11::string::empty(), (uVar14 & 1) == 0)) &&
         (pcVar11 = (char *)std::__cxx11::string::at((ulong)local_a8), *pcVar11 != '-')) {
        peVar8 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        local_140 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                    ::find(peVar8->option_table,(key_type *)local_a8);
        arg = (char *)local_140;
      }
    }
    else {
      QTC::TC("libtests","QPDFArgParser positional",0);
      peVar8 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pmVar2 = peVar8->option_table;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
      local_148 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                  ::find(pmVar2,&local_168);
      arg = (char *)local_148;
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      std::__cxx11::string::operator=((string *)local_48,(char *)parameter.field_2._8_8_);
    }
    peVar8 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    message.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
         ::end(peVar8->option_table);
    bVar5 = std::operator==((_Self *)&arg,(_Self *)((long)&message.field_2 + 8));
    if (bVar5) {
      QTC::TC("libtests","QPDFArgParser unrecognized",0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     "unrecognized argument ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      peVar8 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      poVar3 = peVar8->option_table;
      peVar8 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      if (poVar3 != &peVar8->main_option_table) {
        peVar8 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oe," ("
                       ,&peVar8->option_table_name);
        std::operator+(&local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oe,
                       " options must be terminated with --)");
        std::__cxx11::string::operator+=((string *)local_198,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&oe);
      }
      usage(this,(string *)local_198);
      std::__cxx11::string::~string((string *)local_198);
    }
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>
                            *)&arg);
    message_1.field_2._8_8_ = &ppVar12->second;
    if ((((((OptionEntry *)message_1.field_2._8_8_)->parameter_needed & 1U) != 0) &&
        ((o_arg.field_2._M_local_buf[0xf] & 1U) == 0)) ||
       ((bVar5 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty(&(ppVar12->second).choices), !bVar5 &&
        (((o_arg.field_2._M_local_buf[0xf] & 1U) != 0 &&
         (sVar13 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(message_1.field_2._8_8_ + 0x28),(key_type *)local_48), sVar13 == 0)))
        ))) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                     "--",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8);
      std::operator+(&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                     " must be given as --");
      std::operator+(&local_220,&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     &local_220,"=");
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)local_260);
      bVar5 = std::function::operator_cast_to_bool((function *)(message_1.field_2._8_8_ + 0x98));
      if (bVar5) {
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)(message_1.field_2._8_8_ + 0x98),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
        std::__cxx11::string::operator+=((string *)local_200,"option");
      }
      else {
        bVar5 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(message_1.field_2._8_8_ + 0x28));
        if (bVar5) {
          uVar14 = std::__cxx11::string::empty();
          if ((uVar14 & 1) == 0) {
            QTC::TC("libtests","QPDFArgParser required parameter",0);
            std::__cxx11::string::operator+=
                      ((string *)local_200,(string *)(message_1.field_2._8_8_ + 8));
          }
          else {
            std::__cxx11::string::operator+=((string *)local_200,"option");
          }
        }
        else {
          QTC::TC("libtests","QPDFArgParser required choices",0);
          std::__cxx11::string::operator+=((string *)local_200,"{");
          bVar5 = true;
          this_01 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(message_1.field_2._8_8_ + 0x28);
          __end5 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(this_01);
          choice = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(this_01);
          while (bVar6 = std::operator!=(&__end5,(_Self *)&choice), bVar6) {
            local_288 = std::
                        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&__end5);
            if (bVar5) {
              bVar5 = false;
            }
            else {
              std::__cxx11::string::operator+=((string *)local_200,",");
            }
            std::__cxx11::string::operator+=((string *)local_200,(string *)local_288);
            std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end5);
          }
          std::__cxx11::string::operator+=((string *)local_200,"}");
        }
      }
      usage(this,(string *)local_200);
      std::__cxx11::string::~string((string *)local_200);
    }
    bVar5 = std::function::operator_cast_to_bool((function *)(message_1.field_2._8_8_ + 0x58));
    if (bVar5) {
      if ((o_arg.field_2._M_local_buf[0xf] & 1U) != 0) {
        s_abi_cxx11_(&local_328,"--",2);
        std::operator+(&local_308,&local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                      );
        std::operator+(&local_2e8,&local_308," does not take a parameter, but \"");
        std::operator+(&local_2c8,&local_2e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::operator+(&local_2a8,&local_2c8,"\" was given");
        usage(this,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
      }
      std::function<void_()>::operator()((function<void_()> *)(message_1.field_2._8_8_ + 0x58));
    }
    else {
      bVar5 = std::function::operator_cast_to_bool((function *)(message_1.field_2._8_8_ + 0x78));
      if (bVar5) {
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)(message_1.field_2._8_8_ + 0x78),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      }
    }
    if ((oep._M_node._7_1_ & 1) != 0) break;
    if ((oep._M_node._6_1_ & 1) != 0) {
      selectMainOptionTable(this);
    }
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_48);
    peVar8 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar8->cur_arg = peVar8->cur_arg + 1;
  }
  exit(0);
}

Assistant:

void
QPDFArgParser::parseArgs()
{
    selectMainOptionTable();
    checkCompletion();
    handleArgFileArguments();
    for (m->cur_arg = 1; m->cur_arg < m->argc; ++m->cur_arg) {
        bool help_option = false;
        bool end_option = false;
        auto oep = m->option_table->end();
        char const* arg = m->argv[m->cur_arg];
        std::string parameter;
        bool have_parameter = false;
        std::string o_arg(arg);
        std::string arg_s(arg);
        if (strcmp(arg, "--") == 0) {
            // Special case for -- option, which is used to break out of subparsers.
            oep = m->option_table->find("--");
            end_option = true;
            if (oep == m->option_table->end()) {
                // This is registered automatically, so this can't happen.
                throw std::logic_error("QPDFArgParser: -- handler not registered");
            }
        } else if ((arg[0] == '-') && (strcmp(arg, "-") != 0)) {
            ++arg;
            if (arg[0] == '-') {
                // Be lax about -arg vs --arg
                ++arg;
            } else {
                QTC::TC("libtests", "QPDFArgParser single dash");
            }

            // Prevent --=something from being treated as an empty arg by searching for = from after
            // the first character. We do this since the empty string in the option table is for
            // positional arguments. Besides, it doesn't make sense to have an empty option.
            arg_s = arg;
            size_t equal_pos = std::string::npos;
            if (arg_s.length() > 0) {
                equal_pos = arg_s.find('=', 1);
            }
            if (equal_pos != std::string::npos) {
                have_parameter = true;
                parameter = arg_s.substr(equal_pos + 1);
                arg_s = arg_s.substr(0, equal_pos);
            }

            if ((!m->bash_completion) && (m->argc == 2) && (m->cur_arg == 1) &&
                m->help_option_table.count(arg_s)) {
                // Handle help option, which is only valid as the sole option.
                QTC::TC("libtests", "QPDFArgParser help option");
                oep = m->help_option_table.find(arg_s);
                help_option = true;
            }

            if (!(help_option || arg_s.empty() || (arg_s.at(0) == '-'))) {
                oep = m->option_table->find(arg_s);
            }
        } else {
            // The empty string maps to the positional argument handler.
            QTC::TC("libtests", "QPDFArgParser positional");
            oep = m->option_table->find("");
            parameter = arg;
        }

        if (oep == m->option_table->end()) {
            QTC::TC("libtests", "QPDFArgParser unrecognized");
            std::string message = "unrecognized argument " + o_arg;
            if (m->option_table != &m->main_option_table) {
                message += " (" + m->option_table_name + " options must be terminated with --)";
            }
            usage(message);
        }

        OptionEntry& oe = oep->second;
        if ((oe.parameter_needed && (!have_parameter)) ||
            ((!oe.choices.empty() && have_parameter && (0 == oe.choices.count(parameter))))) {
            std::string message = "--" + arg_s + " must be given as --" + arg_s + "=";
            if (oe.invalid_choice_handler) {
                oe.invalid_choice_handler(parameter);
                // Method should call usage() or exit. Just in case it doesn't...
                message += "option";
            } else if (!oe.choices.empty()) {
                QTC::TC("libtests", "QPDFArgParser required choices");
                message += "{";
                bool first = true;
                for (auto const& choice: oe.choices) {
                    if (first) {
                        first = false;
                    } else {
                        message += ",";
                    }
                    message += choice;
                }
                message += "}";
            } else if (!oe.parameter_name.empty()) {
                QTC::TC("libtests", "QPDFArgParser required parameter");
                message += oe.parameter_name;
            } else {
                // should not be possible
                message += "option";
            }
            usage(message);
        }

        if (oe.bare_arg_handler) {
            if (have_parameter) {
                usage(
                    "--"s + arg_s + " does not take a parameter, but \"" + parameter +
                    "\" was given");
            }
            oe.bare_arg_handler();
        } else if (oe.param_arg_handler) {
            oe.param_arg_handler(parameter);
        }
        if (help_option) {
            exit(0);
        }
        if (end_option) {
            selectMainOptionTable();
        }
    }
    if (m->bash_completion) {
        handleCompletion();
    } else {
        doFinalChecks();
    }
}